

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::charbuff_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  name_space *this;
  name_space *var;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *name;
  name_space *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff57;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff58;
  string local_a0 [55];
  undefined1 local_69 [72];
  allocator local_21;
  string local_20 [32];
  
  std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"get_istream",&local_21);
  cs::make_cni<cs_impl::charbuff_cs_ext::init()::__0>
            (in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
  this = cs::name_space::add_var
                   (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                    (var *)in_stack_ffffffffffffff20);
  name = (string *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"get_ostream",(allocator *)name);
  cs::make_cni<cs_impl::charbuff_cs_ext::init()::__1>
            (in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
  var = cs::name_space::add_var(this,name,(var *)in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"get_string",(allocator *)&stack0xffffffffffffff5f);
  cs::make_cni<cs_impl::charbuff_cs_ext::init()::__2>
            (in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
  cs::name_space::add_var(this,name,(var *)var);
  any::~any((any *)0x2502f2);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  any::~any((any *)0x250310);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  any::~any((any *)0x250334);
  std::__cxx11::string::~string(local_20);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return iVar1;
}

Assistant:

void init()
		{
			(*charbuff_ext)
			.add_var("get_istream", make_cni([](char_buff &buff) -> cs::istream {
				return std::shared_ptr<std::istream>(buff.get(), [](std::istream *) {});
			}))
			.add_var("get_ostream", make_cni([](char_buff &buff) -> cs::ostream {
				return std::shared_ptr<std::ostream>(buff.get(), [](std::ostream *) {});
			}))
			.add_var("get_string", make_cni([](char_buff &buff) -> cs::string {
				return std::move(buff->str());
			}));
		}